

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_cross.cpp
# Opt level: O0

bool __thiscall
diligent_spirv_cross::Compiler::flush_phi_required(Compiler *this,BlockID from,BlockID to)

{
  uint32_t uVar1;
  uint32_t uVar2;
  SPIRBlock *pSVar3;
  Phi *pPVar4;
  Phi *phi;
  Phi *__end1;
  Phi *__begin1;
  SmallVector<diligent_spirv_cross::SPIRBlock::Phi,_8UL> *__range1;
  SPIRBlock *child;
  Compiler *this_local;
  uint32_t local_10;
  BlockID to_local;
  BlockID from_local;
  
  this_local._4_4_ = to.id;
  local_10 = from.id;
  uVar1 = TypedID::operator_cast_to_unsigned_int((TypedID *)((long)&this_local + 4));
  pSVar3 = get<diligent_spirv_cross::SPIRBlock>(this,uVar1);
  __end1 = VectorView<diligent_spirv_cross::SPIRBlock::Phi>::begin
                     (&(pSVar3->phi_variables).
                       super_VectorView<diligent_spirv_cross::SPIRBlock::Phi>);
  pPVar4 = VectorView<diligent_spirv_cross::SPIRBlock::Phi>::end
                     (&(pSVar3->phi_variables).
                       super_VectorView<diligent_spirv_cross::SPIRBlock::Phi>);
  while( true ) {
    if (__end1 == pPVar4) {
      return false;
    }
    uVar1 = TypedID::operator_cast_to_unsigned_int((TypedID *)&__end1->parent);
    uVar2 = TypedID::operator_cast_to_unsigned_int((TypedID *)&local_10);
    if (uVar1 == uVar2) break;
    __end1 = __end1 + 1;
  }
  return true;
}

Assistant:

bool Compiler::flush_phi_required(BlockID from, BlockID to) const
{
	auto &child = get<SPIRBlock>(to);
	for (auto &phi : child.phi_variables)
		if (phi.parent == from)
			return true;
	return false;
}